

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

void __thiscall
cs_impl::
cni_helper<void(*)(cs::numeric_const&,cs::numeric_const&),void(*)(cs::numeric_const&,cs::numeric_const&)>
::_call<0,1>(cni_helper<void(*)(cs::numeric_const&,cs::numeric_const&),void(*)(cs::numeric_const&,cs::numeric_const&)>
             *this,vector *args,sequence<0,_1> *param_2)

{
  numeric *pnVar1;
  numeric *pnVar2;
  
  pnVar1 = try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_0UL>::
           convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_start);
  pnVar2 = try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_1UL>::
           convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_start + 1);
  if (*(long *)(this + 0x10) != 0) {
    (**(code **)(this + 0x18))(this,pnVar1,pnVar2,*(code **)(this + 0x18));
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}